

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

Array<unsigned_char> *
kj::anon_unknown_75::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  size_t sVar1;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar2;
  Array<unsigned_char> *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  byte *pbVar5;
  undefined7 in_register_00000009;
  uint64_t elementCount;
  uchar *puVar6;
  Array<unsigned_char> *p;
  size_t sVar7;
  Array<unsigned_char> *pAVar8;
  byte *pos;
  Array<unsigned_char> part;
  Vector<kj::Array<unsigned_char>_> parts;
  uint64_t limit_local;
  undefined4 local_74;
  Array<unsigned_char> *local_70;
  Fault f_1;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  ulong __n;
  
  parts.builder.ptr = (Array<unsigned_char> *)0x0;
  parts.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  parts.builder.endPtr = (Array<unsigned_char> *)0x0;
  parts.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_74 = (undefined4)CONCAT71(in_register_00000009,nulTerminate);
  limit_local = limit;
  local_70 = __return_storage_ptr__;
  do {
    _kjCondition.left = &limit_local;
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.op.content.ptr = " > ";
    _kjCondition.op.content.size_ = 4;
    _kjCondition.result = limit_local != 0;
    if (limit_local == 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
                ((Fault *)&part,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x4e,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",&_kjCondition
                 ,(char (*) [26])"Reached limit before EOF.");
      kj::_::Debug::Fault::fatal((Fault *)&part);
    }
    elementCount = limit_local;
    if (0xfff < limit_local) {
      elementCount = 0x1000;
    }
    part.ptr = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                  (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
    part.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    part.size_ = elementCount;
    iVar4 = (*input->_vptr_InputStream[2])(input,part.ptr,elementCount);
    sVar1 = part.size_;
    __n = CONCAT44(extraout_var,iVar4);
    limit_local = limit_local - __n;
    if (__n < part.size_) {
      sVar7 = ((ulong)((long)parts.builder.pos - (long)parts.builder.ptr) >> 3) *
              -0x5555555555555000 + (CONCAT71(in_register_00000009,nulTerminate) & 0xffffffff) + __n
      ;
      pos = (byte *)kj::_::HeapArrayDisposer::allocateImpl
                              (1,sVar7,sVar7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      pRVar2 = parts.builder.pos;
      __return_storage_ptr__->ptr = pos;
      __return_storage_ptr__->size_ = sVar7;
      __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      for (pAVar8 = parts.builder.ptr; pAVar8 != pRVar2; pAVar8 = pAVar8 + 1) {
        puVar6 = pos + 0x1000;
        memcpy(pos,pAVar8->ptr,0x1000);
        pos = puVar6;
      }
      memcpy(pos,part.ptr,__n);
      pbVar5 = pos + __n;
      pos = pbVar5;
      if ((char)local_74 != '\0') {
        pos = pbVar5 + 1;
        *pbVar5 = '\0';
      }
      _kjCondition._8_8_ = local_70->ptr + local_70->size_;
      _kjCondition.left = (unsigned_long *)&pos;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.result = pos == (byte *)_kjCondition._8_8_;
      _kjCondition.op.content.size_ = 5;
      __return_storage_ptr__ = local_70;
      if (!_kjCondition.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char*&,unsigned_char*>&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                   ,0x5c,FAILED,"pos == result.end()","_kjCondition,",
                   (DebugComparison<unsigned_char_*&,_unsigned_char_*> *)&_kjCondition);
        kj::_::Debug::Fault::fatal(&f_1);
      }
    }
    else {
      if (parts.builder.pos == parts.builder.endPtr) {
        sVar7 = ((long)parts.builder.endPtr - (long)parts.builder.ptr >> 3) * 0x5555555555555556;
        if (parts.builder.endPtr == parts.builder.ptr) {
          sVar7 = 4;
        }
        Vector<kj::Array<unsigned_char>_>::setCapacity(&parts,sVar7);
      }
      (parts.builder.pos)->ptr = part.ptr;
      (parts.builder.pos)->size_ = part.size_;
      (parts.builder.pos)->disposer = part.disposer;
      part.ptr = (uchar *)0x0;
      part.size_ = 0;
      parts.builder.pos = parts.builder.pos + 1;
    }
    sVar7 = part.size_;
    puVar6 = part.ptr;
    if (part.ptr != (uchar *)0x0) {
      part.ptr = (uchar *)0x0;
      part.size_ = 0;
      (*(code *)**(undefined8 **)part.disposer)(part.disposer,puVar6,1,sVar7,sVar7,0);
    }
    pAVar3 = parts.builder.endPtr;
    pRVar2 = parts.builder.pos;
    pAVar8 = parts.builder.ptr;
    if (__n < sVar1) {
      if (parts.builder.ptr != (Array<unsigned_char> *)0x0) {
        parts.builder.ptr = (Array<unsigned_char> *)0x0;
        parts.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
        parts.builder.endPtr = (Array<unsigned_char> *)0x0;
        (*(code *)**(undefined8 **)parts.builder.disposer)
                  (parts.builder.disposer,pAVar8,0x18,
                   ((long)pRVar2 - (long)pAVar8 >> 3) * -0x5555555555555555,
                   ((long)pAVar3 - (long)pAVar8 >> 3) * -0x5555555555555555,
                   ArrayDisposer::Dispose_<kj::Array<unsigned_char>_>::destruct);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part, part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}